

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco_Apu.cpp
# Opt level: O0

void __thiscall Nes_Namco_Apu::run_until(Nes_Namco_Apu *this,blip_time_t nes_end_time)

{
  byte bVar1;
  Blip_Buffer *this_00;
  int iVar2;
  int iVar3;
  blip_resampled_time_t bVar4;
  uint uVar5;
  blip_resampled_time_t bVar6;
  int delta_00;
  int *piVar7;
  byte *pbVar8;
  int iVar9;
  blip_time_t in_ESI;
  long in_RDI;
  int delta;
  int sample;
  int addr;
  int wave_pos;
  int last_amp;
  int wave_size;
  blip_resampled_time_t period;
  blargg_long freq;
  int volume;
  uint8_t *osc_reg;
  blip_resampled_time_t end_time;
  blip_resampled_time_t time;
  Blip_Buffer *output;
  Namco_Osc *osc;
  int i;
  int active_oscs;
  int local_50;
  int local_4c;
  blip_resampled_time_t local_2c;
  int local_14;
  
  iVar3 = ((int)(uint)*(byte *)(in_RDI + 0x147) >> 4 & 7U) + 1;
  local_14 = 8 - iVar3;
  do {
    if (7 < local_14) {
      *(blip_time_t *)(in_RDI + 0xc0) = in_ESI;
      return;
    }
    piVar7 = (int *)(in_RDI + (long)local_14 * 0x18);
    this_00 = *(Blip_Buffer **)(piVar7 + 2);
    if (this_00 != (Blip_Buffer *)0x0) {
      Blip_Buffer::set_modified(this_00);
      bVar4 = Blip_Buffer::resampled_time(this_00,*(blip_time_t *)(in_RDI + 0xc0));
      local_2c = bVar4 + *piVar7;
      bVar4 = Blip_Buffer::resampled_time(this_00,in_ESI);
      *piVar7 = 0;
      if (local_2c < bVar4) {
        pbVar8 = (byte *)(in_RDI + 200 + (long)(local_14 * 8 + 0x40));
        if ((((pbVar8[4] & 0xe0) != 0) && (bVar1 = pbVar8[7], (bVar1 & 0xf) != 0)) &&
           (uVar5 = (pbVar8[4] & 3) * 0x10000 + (uint)pbVar8[2] * 0x100 + (uint)*pbVar8,
           (uint)(iVar3 * 0x40) <= uVar5)) {
          bVar6 = Blip_Buffer::resampled_duration(this_00,0xf0000);
          iVar2 = ((int)(uint)pbVar8[4] >> 2 & 7U) * -4;
          if (iVar2 != -0x20) {
            local_4c = (int)(short)piVar7[4];
            local_50 = (int)*(short *)((long)piVar7 + 0x12);
            do {
              iVar9 = local_50 + (uint)pbVar8[6];
              local_50 = local_50 + 1;
              iVar9 = ((int)(uint)*(byte *)(in_RDI + 200 + (long)(iVar9 >> 1)) >>
                       ((char)iVar9 * '\x04' & 4U) & 0xfU) * (bVar1 & 0xf);
              delta_00 = iVar9 - local_4c;
              if (delta_00 != 0) {
                Blip_Synth<12,_15>::offset_resampled
                          ((Blip_Synth<12,_15> *)(in_RDI + 0x148),local_2c,delta_00,this_00);
                local_4c = iVar9;
              }
              local_2c = (bVar6 / uVar5) * iVar3 + local_2c;
              if (iVar2 + 0x20 <= local_50) {
                local_50 = 0;
              }
            } while (local_2c < bVar4);
            *(short *)((long)piVar7 + 0x12) = (short)local_50;
            *(short *)(piVar7 + 4) = (short)local_4c;
            goto LAB_00987947;
          }
        }
      }
      else {
LAB_00987947:
        *piVar7 = local_2c - bVar4;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void Nes_Namco_Apu::run_until( blip_time_t nes_end_time )
{
	int active_oscs = (reg [0x7F] >> 4 & 7) + 1;
	for ( int i = osc_count - active_oscs; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		Blip_Buffer* output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_resampled_time_t time =
				output->resampled_time( last_time ) + osc.delay;
		blip_resampled_time_t end_time = output->resampled_time( nes_end_time );
		osc.delay = 0;
		if ( time < end_time )
		{
			const BOOST::uint8_t* osc_reg = &reg [i * 8 + 0x40];
			if ( !(osc_reg [4] & 0xE0) )
				continue;
			
			int volume = osc_reg [7] & 15;
			if ( !volume )
				continue;
			
			blargg_long freq = (osc_reg [4] & 3) * 0x10000 + osc_reg [2] * 0x100L + osc_reg [0];
			if ( freq < 64 * active_oscs )
				continue; // prevent low frequencies from excessively delaying freq changes
			blip_resampled_time_t period =
					output->resampled_duration( 983040 ) / freq * active_oscs;
			
			int wave_size = 32 - (osc_reg [4] >> 2 & 7) * 4;
			if ( !wave_size )
				continue;
			
			int last_amp = osc.last_amp;
			int wave_pos = osc.wave_pos;
			
			do
			{
				// read wave sample
				int addr = wave_pos + osc_reg [6];
				int sample = reg [addr >> 1] >> (addr << 2 & 4);
				wave_pos++;
				sample = (sample & 15) * volume;
				
				// output impulse if amplitude changed
				int delta = sample - last_amp;
				if ( delta )
				{
					last_amp = sample;
					synth.offset_resampled( time, delta, output );
				}
				
				// next sample
				time += period;
				if ( wave_pos >= wave_size )
					wave_pos = 0;
			}
			while ( time < end_time );
			
			osc.wave_pos = wave_pos;
			osc.last_amp = last_amp;
		}
		osc.delay = time - end_time;
	}
	
	last_time = nes_end_time;
}